

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Loop.hpp
# Opt level: O2

void __thiscall uv::Loop::run(Loop *this)

{
  Exception *this_00;
  error_code ec_00;
  error_code ec;
  
  ec._M_value = 0;
  ec._M_cat = (error_category *)std::_V2::system_category();
  run(this,&ec);
  if (ec._M_value == 0) {
    return;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x38);
  ec_00._4_4_ = 0;
  ec_00._M_value = ec._M_value;
  ec_00._M_cat = ec._M_cat;
  Exception::Exception(this_00,ec_00);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

inline void Loop::run()
	{
		std::error_code ec;

		run(ec);
		if (ec) {
			throw uv::Exception(ec);
		}
	}